

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O1

void __thiscall CVmObjDict::build_hash_from_image(CVmObjDict *this)

{
  ushort uVar1;
  ushort uVar2;
  undefined4 uVar3;
  char *pcVar4;
  undefined4 *puVar5;
  long lVar6;
  ulong uVar7;
  CVmHashEntryDict *this_00;
  uint uVar8;
  ulong __n;
  vm_obj_id_t *pvVar9;
  uint uVar10;
  char key_buf [256];
  byte local_138 [264];
  
  pcVar4 = (this->super_CVmObject).ext_;
  puVar5 = *(undefined4 **)pcVar4;
  lVar6 = *(long *)(pcVar4 + 8);
  uVar3 = *puVar5;
  uVar8 = 0;
  pcVar4[0x20] = '\0';
  pcVar4[0x21] = '\0';
  pcVar4[0x22] = '\0';
  pcVar4[0x23] = '\0';
  pcVar4 = (this->super_CVmObject).ext_;
  pcVar4[0x30] = '\0';
  pcVar4[0x31] = '\0';
  pcVar4[0x32] = '\0';
  pcVar4[0x33] = '\0';
  pcVar4 = (this->super_CVmObject).ext_;
  pcVar4[0x28] = '\0';
  pcVar4[0x29] = '\0';
  pcVar4[0x2a] = '\0';
  pcVar4[0x2b] = '\0';
  pcVar4[0x2c] = '\0';
  pcVar4[0x2d] = '\0';
  pcVar4[0x2e] = '\0';
  pcVar4[0x2f] = '\0';
  create_hash_table(this);
  uVar1 = *(ushort *)(puVar5 + 1);
  if (uVar1 != 0 && 6 < lVar6) {
    pvVar9 = (vm_obj_id_t *)((long)puVar5 + 6);
    do {
      __n = (ulong)(byte)*pvVar9;
      memcpy(local_138,(byte *)((long)pvVar9 + 1),__n);
      if (__n != 0) {
        uVar7 = 0;
        do {
          local_138[uVar7] = local_138[uVar7] ^ 0xbd;
          uVar7 = uVar7 + 1;
        } while (__n != uVar7);
      }
      uVar2 = *(ushort *)((long)pvVar9 + __n + 1);
      uVar10 = (uint)uVar2;
      this_00 = (CVmHashEntryDict *)
                CVmHashTable::find(*(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10),
                                   (char *)local_138,__n);
      if (this_00 == (CVmHashEntryDict *)0x0) {
        this_00 = (CVmHashEntryDict *)operator_new(0x30);
        CVmHashEntry::CVmHashEntry((CVmHashEntry *)this_00,(char *)local_138,__n,1);
        (this_00->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry =
             (_func_int **)&PTR__CVmHashEntryDict_0036ac48;
        this_00->list_ = (vm_dict_entry *)0x0;
        CVmHashTable::add(*(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10),
                          (CVmHashEntry *)this_00);
      }
      pvVar9 = (vm_obj_id_t *)((long)pvVar9 + __n + 3);
      if (uVar2 != 0) {
        do {
          CVmHashEntryDict::add_entry(this_00,*pvVar9,(vm_prop_id_t)pvVar9[1],1);
          pvVar9 = (vm_obj_id_t *)((long)pvVar9 + 6);
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
    } while ((pvVar9 < (vm_obj_id_t *)(lVar6 + (long)puVar5)) && (uVar8 = uVar8 + 1, uVar8 < uVar1))
    ;
  }
  *(undefined4 *)((this->super_CVmObject).ext_ + 0x20) = uVar3;
  return;
}

Assistant:

void CVmObjDict::build_hash_from_image(VMG0_)
{
    uint cnt;
    uint i;
    const char *p;
    const char *endp;
    vm_obj_id_t comp;

    /* start reading at the start of the image data */
    p = get_ext()->image_data_;
    endp = p + get_ext()->image_data_size_;

    /* read the comparator object ID */
    comp = (vm_obj_id_t)t3rp4u(p);
    p += 4;

    /*
     *   Do NOT install the actual comparator object at this point, but
     *   simply build the table tentatively with a nil comparator.  We can't
     *   assume that the comparator object has been loaded yet (as it might
     *   be loaded after us), so we cannot use it to build the hash table.
     *   We have to do something with the data, though, so build the hash
     *   table tentatively with no comparator; we'll rebuild it again at
     *   post-load-init time with the real comparator.
     *   
     *   (This isn't as inefficient as it sounds, as we retain all of the
     *   original hash table entries when we rebuild the table.  All we end
     *   up doing is scanning the entries again to recompute their new hash
     *   values, and reallocating the hash table object itself.)  
     */
    get_ext()->comparator_ = VM_INVALID_OBJ;
    set_comparator_type(vmg_ VM_INVALID_OBJ);

    /* create the new hash table */
    create_hash_table(vmg0_);

    /* read the entry count */
    cnt = osrp2(p);
    p += 2;

    /* scan the entries */
    for (i = 0 ; p < endp && i < cnt ; ++i)
    {
        vm_obj_id_t obj;
        vm_prop_id_t prop;
        uint key_len;
        uint item_cnt;
        const char *key;
        CVmHashEntryDict *entry;
        char key_buf[256];
        char *keyp;
        size_t key_rem;

        /* read the key length */
        key_len = *(unsigned char *)p++;

        /* remember the key pointer */
        key = p;
        p += key_len;

        /* copy the key to our buffer for decoding */
        memcpy(key_buf, key, key_len);

        /* decode the key */
        for (keyp = key_buf, key_rem = key_len ; key_rem != 0 ;
             --key_rem, ++keyp)
            *keyp ^= 0xBD;

        /* read the key from the decoded buffer now */
        key = key_buf;

        /* read the item count */
        item_cnt = osrp2(p);
        p += 2;

        /* find an existing entry for this key */
        entry = (CVmHashEntryDict *)get_ext()->hashtab_->find(key, key_len);

        /* if there's no existing entry, add one */
        if (entry == 0)
        {
            /* create a new entry */
            entry = new CVmHashEntryDict(key, key_len, TRUE, TRUE);

            /* add it to the table */
            get_ext()->hashtab_->add(entry);
        }

        /* read the items */
        for ( ; item_cnt != 0 ; --item_cnt)
        {
            /* read the object ID and property ID */
            obj = (vm_obj_id_t)t3rp4u(p);
            prop = (vm_prop_id_t)osrp2(p + 4);

            /* 
             *   add the entry - this entry is from the image file, so
             *   mark it as such 
             */
            entry->add_entry(obj, prop, TRUE);

            /* move on to the next item */
            p += 6;
        }
    }

    /* 
     *   Now that we're done building the table, remember the comparator.  We
     *   can't set the type yet, because the object might not be loaded yet -
     *   defer this until post-load initialization time.  
     */
    get_ext()->comparator_ = comp;
}